

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c
# Opt level: O3

JSON_VALUE * json_parse(char *input)

{
  uint uVar1;
  JSON_VALUE *pJVar2;
  uint uVar3;
  size_t sVar4;
  void *pvVar5;
  char *pcVar6;
  JSON_VALUE *pJVar7;
  JSON_VALUE **ppJVar8;
  char cVar9;
  ulong uVar10;
  ulong uVar11;
  size_t sVar12;
  ulong uVar13;
  size_t sVar14;
  byte bVar15;
  int iVar16;
  char *pcVar17;
  ulong uVar18;
  long lVar19;
  uint *puVar20;
  bool bVar21;
  JSON_VALUE *stack [8];
  JSON_VALUE *local_78 [9];
  
  sVar4 = strlen(input);
  if (sVar4 == 0) {
    return (JSON_VALUE *)0x0;
  }
  iVar16 = 0;
  uVar11 = 0;
LAB_00103642:
  pcVar6 = (char *)0x0;
LAB_00103651:
  do {
    pcVar17 = pcVar6;
    uVar18 = uVar11;
    bVar15 = input[uVar18];
    pvVar5 = memchr(" \t\r\n",(int)(char)bVar15,5);
    uVar13 = uVar18 + 1;
    uVar11 = uVar13;
    pcVar6 = pcVar17;
  } while (pvVar5 != (void *)0x0);
  if (bVar15 == 0x22) {
    pcVar6 = (char *)0x0;
    uVar11 = 0;
    sVar14 = 0;
    do {
      cVar9 = input[uVar13];
      if (cVar9 == '\\') {
        bVar15 = (input + 1)[uVar13];
        lVar19 = 2;
        if (0x6d < bVar15) {
          if (bVar15 == 0x74) {
            cVar9 = '\t';
          }
          else if (bVar15 == 0x72) {
            cVar9 = '\r';
          }
          else {
            if (bVar15 != 0x6e) goto LAB_001036cc;
            cVar9 = '\n';
          }
          goto LAB_00103699;
        }
        if (bVar15 == 0x22) {
          cVar9 = '\"';
          goto LAB_00103699;
        }
        if (bVar15 == 0x5c) {
          cVar9 = '\\';
          goto LAB_00103699;
        }
      }
      else {
        if (cVar9 == '\"') goto LAB_0010370f;
        lVar19 = 1;
LAB_00103699:
        if (sVar14 <= uVar11) {
          bVar21 = sVar14 == 0;
          sVar14 = sVar14 * 2;
          if (bVar21) {
            sVar14 = 8;
          }
          pcVar6 = (char *)realloc(pcVar6,sVar14);
        }
        pcVar6[uVar11] = cVar9;
        uVar11 = uVar11 + 1;
      }
LAB_001036cc:
      uVar13 = uVar13 + lVar19;
    } while( true );
  }
  if (bVar15 < 0x6e) {
    if (bVar15 < 0x5d) {
      if (bVar15 == 0x2c) {
        pJVar7 = (JSON_VALUE *)0x0;
        goto LAB_0010387e;
      }
      if (bVar15 == 0x5b) {
        pJVar7 = (JSON_VALUE *)calloc(1,0x20);
        pJVar7->type = JSON_ARRAY;
        goto LAB_0010387e;
      }
    }
    else {
      if (bVar15 == 0x5d) {
LAB_0010382c:
        iVar16 = iVar16 + -1;
        pJVar7 = (JSON_VALUE *)0x0;
        goto LAB_0010387e;
      }
      if (bVar15 == 0x66) {
        pJVar7 = (JSON_VALUE *)calloc(1,0x20);
        pJVar7->type = JSON_FALSE;
        uVar13 = uVar18 + 5;
        goto LAB_0010387e;
      }
    }
  }
  else {
    if (bVar15 < 0x7b) {
      if (bVar15 == 0x6e) {
        pJVar7 = (JSON_VALUE *)calloc(1,0x20);
        pJVar7->type = JSON_NULL;
      }
      else {
        if (bVar15 != 0x74) goto LAB_001039a9;
        pJVar7 = (JSON_VALUE *)calloc(1,0x20);
        pJVar7->type = JSON_TRUE;
      }
      uVar13 = uVar18 + 4;
      goto LAB_0010387e;
    }
    if (bVar15 == 0x7b) {
      pJVar7 = (JSON_VALUE *)calloc(1,0x20);
      pJVar7->type = JSON_OBJECT;
      goto LAB_0010387e;
    }
    if (bVar15 == 0x7d) goto LAB_0010382c;
  }
LAB_001039a9:
  sVar14 = 8;
  pvVar5 = memchr(" \t\r\n,]}",(int)(char)bVar15,8);
  if (pvVar5 != (void *)0x0) {
    pcVar6 = (char *)0x0;
    uVar10 = 0;
    goto LAB_00103a4c;
  }
  uVar10 = 0;
  pcVar6 = (char *)0x0;
  uVar11 = 0;
  do {
    sVar12 = uVar11;
    if (uVar11 <= uVar10) {
      sVar12 = uVar11 * 2;
      if (uVar11 == 0) {
        sVar12 = 8;
      }
      pcVar6 = (char *)realloc(pcVar6,sVar12);
    }
    pcVar6[uVar10] = bVar15;
    uVar10 = uVar10 + 1;
    bVar15 = (input + 1)[uVar18];
    uVar18 = uVar18 + 1;
    pvVar5 = memchr(" \t\r\n,]}",(int)(char)bVar15,8);
    uVar11 = sVar12;
  } while (pvVar5 == (void *)0x0);
  uVar13 = uVar18;
  if (sVar12 <= uVar10) {
    sVar14 = sVar12 * 2;
    if (sVar12 == 0) {
      sVar14 = 8;
    }
LAB_00103a4c:
    pcVar6 = (char *)realloc(pcVar6,sVar14);
    uVar13 = uVar18;
  }
  pcVar6[uVar10] = '\0';
  pJVar7 = (JSON_VALUE *)calloc(1,0x20);
  pJVar7->type = JSON_STRING;
  (pJVar7->data).str = pcVar6;
  goto LAB_0010387e;
LAB_0010370f:
  if (sVar14 <= uVar11) {
    sVar12 = sVar14 * 2;
    if (sVar14 == 0) {
      sVar12 = 8;
    }
    pcVar6 = (char *)realloc(pcVar6,sVar12);
  }
  pcVar6[uVar11] = '\0';
  uVar11 = uVar13 + 1;
  do {
    uVar13 = uVar11;
    cVar9 = input[uVar13];
    pvVar5 = memchr(" \t\r\n",(int)cVar9,5);
    uVar11 = uVar13 + 1;
  } while (pvVar5 != (void *)0x0);
  if (cVar9 != ':') goto code_r0x00103764;
  goto LAB_00103651;
code_r0x00103764:
  pJVar7 = (JSON_VALUE *)calloc(1,0x20);
  pJVar7->type = JSON_STRING;
  (pJVar7->data).str = pcVar6;
LAB_0010387e:
  uVar11 = uVar13 + 0xffffffffffffffff;
  do {
    pvVar5 = memchr(" \t\r\n",(int)(input + 1)[uVar11],5);
    uVar11 = uVar11 + 1;
  } while (pvVar5 != (void *)0x0);
  if (pJVar7 == (JSON_VALUE *)0x0) goto LAB_00103994;
  if (0 < iVar16) {
    pJVar2 = local_78[iVar16 - 1];
    if (pcVar17 == (char *)0x0) {
      if (pJVar2->type == JSON_ARRAY) {
        puVar20 = &(pJVar2->data).array.n;
        uVar3 = (pJVar2->data).array.n;
        uVar1 = (pJVar2->data).array.alloced;
        ppJVar8 = (JSON_VALUE **)(pJVar2->data).str;
        if (uVar1 <= uVar3) {
          uVar13 = (ulong)(uVar1 * 2);
          if (uVar1 == 0) {
            uVar13 = 4;
          }
          (pJVar2->data).array.alloced = (uint)uVar13;
          ppJVar8 = (JSON_VALUE **)realloc(ppJVar8,uVar13 << 5);
          (pJVar2->data).str = (char *)ppJVar8;
          goto LAB_00103961;
        }
        goto LAB_00103964;
      }
    }
    else if (pJVar2->type == JSON_OBJECT) {
      uVar1 = (pJVar2->data).obj.alloced;
      uVar3 = (pJVar2->data).obj.n;
      if (uVar1 <= uVar3) {
        uVar13 = (ulong)(uVar1 * 2);
        if (uVar1 == 0) {
          uVar13 = 4;
        }
        (pJVar2->data).obj.alloced = (uint)uVar13;
        pcVar6 = (char *)realloc((pJVar2->data).str,uVar13 << 3);
        (pJVar2->data).str = pcVar6;
        ppJVar8 = (JSON_VALUE **)
                  realloc((pJVar2->data).obj.values,(ulong)(pJVar2->data).obj.alloced << 5);
        (pJVar2->data).obj.values = ppJVar8;
        uVar3 = (pJVar2->data).obj.n;
      }
      puVar20 = &(pJVar2->data).obj.n;
      *(char **)((pJVar2->data).str + (ulong)uVar3 * 8) = pcVar17;
      ppJVar8 = (pJVar2->data).obj.values;
LAB_00103961:
      uVar3 = *puVar20;
LAB_00103964:
      ppJVar8[uVar3] = pJVar7;
      *puVar20 = *puVar20 + 1;
    }
  }
  if ((pJVar7->type == JSON_OBJECT) || (iVar16 == 0 || pJVar7->type == JSON_ARRAY)) {
    local_78[iVar16] = pJVar7;
    iVar16 = iVar16 + 1;
  }
LAB_00103994:
  if (sVar4 <= uVar11) {
    return local_78[0];
  }
  goto LAB_00103642;
}

Assistant:

JSON_VALUE*
json_parse(const char* input)
{
    off_t off = 0;
    size_t len;
    JSON_VALUE* stack[8];
    int stack_top = 0;

    len = strlen(input);

    while(off < len) {
        char* key = NULL;
        JSON_VALUE* v = NULL;

after_key:
        while(strchr(" \t\r\n", input[off]) != NULL)
            off++;

        switch(input[off]) {
            case '{':
                v = json_alloc_value(JSON_OBJECT);
                off++;
                break;

            case '[':
                v = json_alloc_value(JSON_ARRAY);
                off++;
                break;

            case 'n':
                v = json_alloc_value(JSON_NULL);
                off += strlen("null");
                break;

            case 'f':
                v = json_alloc_value(JSON_FALSE);
                off += strlen("false");
                break;

            case 't':
                v = json_alloc_value(JSON_TRUE);
                off += strlen("true");
                break;

            case ']':
            case '}':
                off++;
                stack_top--;
                break;

            case ',':
                off++;
                break;

            case '"':
            {
                char* str;

                off = json_create_string(input, off, &str);

                while(strchr(" \t\r\n", input[off]) != NULL)
                    off++;
                if(input[off] == ':') {
                    off++;
                    key = str;
                    goto after_key;
                } else {
                    v = json_alloc_value(JSON_STRING);
                    v->data.str = str;
                }
                break;
            }

            default:
            {
                char* str;

                off = json_create_unqoted_string(input, off, &str);
                v = json_alloc_value(JSON_STRING);
                v->data.str = str;
                break;
            }
        }

        while(strchr(" \t\r\n", input[off]) != NULL)
            off++;

        if(v != NULL) {
            if(stack_top > 0)
                json_add_value(stack[stack_top-1], key, v);

            if(v->type == JSON_OBJECT || v->type == JSON_ARRAY || stack_top == 0) {
                stack[stack_top] = v;
                stack_top++;
            }
        }
    }

    return stack[0];
}